

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

shared_ptr<kratos::Var> __thiscall
kratos::VarVarSlice::slice_var(VarVarSlice *this,shared_ptr<kratos::Var> *var)

{
  element_type *peVar1;
  __shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Var> sVar2;
  enable_shared_from_this<kratos::Var> local_30;
  shared_ptr<kratos::Var> *var_local;
  VarVarSlice *this_local;
  
  var_local = var;
  this_local = this;
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  sVar2 = std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_30);
  (*(peVar1->super_IRNode)._vptr_IRNode[10])
            (peVar1,&local_30,
             sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)this);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_30);
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> slice_var(std::shared_ptr<Var> var) override {
        return var->operator[](sliced_var_->shared_from_this()).shared_from_this();
    }